

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.h
# Opt level: O0

void __thiscall
embree::CommandLineParser::
CommandLineOptionClosure<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/embree[P]embree/tutorials/common/tutorial/tutorial.cpp:410:34)>
::parse(CommandLineOptionClosure<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_embree[P]embree_tutorials_common_tutorial_tutorial_cpp:410:34)>
        *this,Ref<embree::ParseStream> *cin,FileName *path)

{
  long *in_RSI;
  long *local_40 [5];
  FileName *path_00;
  Ref<embree::ParseStream> *in_stack_fffffffffffffff0;
  anon_class_8_1_8991fb9c_for_f *in_stack_fffffffffffffff8;
  
  path_00 = (FileName *)local_40;
  local_40[0] = (long *)*in_RSI;
  if (local_40[0] != (long *)0x0) {
    (**(code **)(*local_40[0] + 0x10))();
  }
  anon_class_8_1_8991fb9c_for_f::operator()
            (in_stack_fffffffffffffff8,in_stack_fffffffffffffff0,path_00);
  if (local_40[0] != (long *)0x0) {
    (**(code **)(*local_40[0] + 0x18))();
  }
  return;
}

Assistant:

virtual void parse(Ref<ParseStream> cin, const FileName& path) {
        f(cin,path);
      }